

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zm.c
# Opt level: O1

size_t zmCreateCrand_deep(size_t no)

{
  size_t sVar1;
  size_t sVar2;
  size_t sVar3;
  size_t sVar4;
  ulong n;
  
  n = no + 7 >> 3;
  sVar1 = zmMulCrand_deep(n);
  sVar2 = zmSqrCrand_deep(n);
  sVar3 = zzInvMod_deep(n);
  sVar4 = zzDivMod_deep(n);
  sVar1 = utilMax(4,sVar1,sVar2,sVar3,sVar4);
  return sVar1;
}

Assistant:

size_t zmCreateCrand_deep(size_t no)
{
	const size_t n = W_OF_O(no);
	return utilMax(4,
		zmMulCrand_deep(n),
		zmSqrCrand_deep(n),
		zmInv_deep(n),
		zmDiv_deep(n));
}